

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void __thiscall HighsBasis::print(HighsBasis *this,string *message)

{
  pointer pHVar1;
  HighsInt iCol;
  ulong uVar2;
  string sStack_38;
  
  if (this->useful == true) {
    std::__cxx11::string::string((string *)&sStack_38,(string *)message);
    printScalars(this,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    for (uVar2 = 0;
        pHVar1 = (this->col_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)uVar2 <
        (long)(*(int *)&(this->col_status).
                        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (int)pHVar1); uVar2 = uVar2 + 1)
    {
      printf("Basis: col_status[%2d] = %d\n",uVar2 & 0xffffffff,(ulong)pHVar1[uVar2]);
    }
    for (uVar2 = 0;
        pHVar1 = (this->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)uVar2 <
        (long)(*(int *)&(this->row_status).
                        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (int)pHVar1); uVar2 = uVar2 + 1)
    {
      printf("Basis: row_status[%2d] = %d\n",uVar2 & 0xffffffff,(ulong)pHVar1[uVar2]);
    }
  }
  return;
}

Assistant:

void HighsBasis::print(std::string message) const {
  if (!this->useful) return;
  this->printScalars(message);
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_status.size()); iCol++)
    printf("Basis: col_status[%2d] = %d\n", int(iCol),
           int(this->col_status[iCol]));
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_status.size()); iRow++)
    printf("Basis: row_status[%2d] = %d\n", int(iRow),
           int(this->row_status[iRow]));
}